

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::shapeConstructorTest<true>(ViewTest *this)

{
  unsigned_long *puVar1;
  undefined8 uVar2;
  value_type *__val_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  size_t sVar4;
  logic_error *plVar5;
  reference piVar6;
  bool bVar7;
  long lVar8;
  code *pcVar9;
  value_type *__val;
  undefined *puVar10;
  size_t sVar11;
  ulong uVar12;
  ulong args;
  ulong uVar13;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_81;
  int *local_80;
  undefined1 local_78 [16];
  size_t *local_68;
  size_t local_50;
  ulong local_48;
  unsigned_long *local_38;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_80 = this->data_;
  local_78._0_8_ = local_80;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,&local_81);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
  if ((int *)local_78._0_8_ == (int *)0x0) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar5,"Assertion failed.");
    pcVar9 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
  }
  else {
    if ((local_50 == 1) && (local_48 == 0x18)) {
      bVar7 = true;
      sVar11 = 0;
      while (bVar7) {
        sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,sVar11);
        bVar7 = false;
        puVar1 = _Var3._M_current + sVar11;
        sVar11 = 1;
        if (sVar4 != *puVar1) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"test failed.");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      if (local_48 != 0) {
        sVar11 = 0;
        do {
          piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                             ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,sVar11);
          if (*piVar6 != local_80[sVar11]) {
            plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar5,"test failed.");
            __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 < local_48);
      }
      operator_delete(local_68,local_50 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(0x10);
      *_Var3._M_current = 0;
      _Var3._M_current[1] = 0;
      *_Var3._M_current = 6;
      _Var3._M_current[1] = 4;
      local_78._0_8_ = local_80;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,&local_81);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
      if ((int *)local_78._0_8_ == (int *)0x0) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar5,"Assertion failed.");
        pcVar9 = std::runtime_error::~runtime_error;
        puVar10 = &std::runtime_error::typeinfo;
      }
      else {
        if ((local_50 == 2) && (local_48 == 0x18)) {
          sVar11 = 0;
          do {
            sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,sVar11);
            if (sVar4 != _Var3._M_current[sVar11]) {
              plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar5,"test failed.");
              __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 == 1);
          if (local_48 != 0) {
            sVar11 = 0;
            do {
              piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                 ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,sVar11
                                 );
              if (*piVar6 != local_80[sVar11]) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar11 = sVar11 + 1;
            } while (sVar11 < local_48);
          }
          uVar13 = 0;
          while( true ) {
            sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                               ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,0);
            if (sVar11 <= uVar13) break;
            uVar12 = 0;
            while( true ) {
              sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                 ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,1);
              if (sVar11 <= uVar12) break;
              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                                 ((View<int,true,std::allocator<unsigned_long>> *)local_78,uVar13,
                                  uVar12);
              lVar8 = *_Var3._M_current * uVar12;
              uVar12 = uVar12 + 1;
              if (*piVar6 != local_80[lVar8 + uVar13]) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
            uVar13 = uVar13 + 1;
          }
          operator_delete(local_68,local_50 * 0x18);
          operator_delete(_Var3._M_current,0x10);
          local_38 = (unsigned_long *)operator_new(0x18);
          *local_38 = 0;
          local_38[1] = 0;
          *local_38 = 2;
          local_38[1] = 4;
          local_38[2] = 3;
          local_78._0_8_ = local_80;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_38,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(local_38 + 3),&andres::defaultOrder,&andres::defaultOrder,&local_81);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
          if ((int *)local_78._0_8_ == (int *)0x0) {
            plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar5,"Assertion failed.");
            pcVar9 = std::runtime_error::~runtime_error;
            puVar10 = &std::runtime_error::typeinfo;
          }
          else {
            if ((local_50 == 3) && (local_48 == 0x18)) {
              sVar11 = 0;
              do {
                sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,
                                   sVar11);
                if (sVar4 != local_38[sVar11]) {
                  plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar5,"test failed.");
                  __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                sVar11 = sVar11 + 1;
              } while (sVar11 != 3);
              if (local_48 != 0) {
                sVar11 = 0;
                do {
                  piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,
                                      sVar11);
                  if (*piVar6 != local_80[sVar11]) {
                    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar5,"test failed.");
                    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  sVar11 = sVar11 + 1;
                } while (sVar11 < local_48);
              }
              uVar13 = 0;
              do {
                sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                   ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,0);
                if (sVar11 <= uVar13) {
                  operator_delete(local_68,local_50 * 0x18);
                  operator_delete(local_38,0x18);
                  return;
                }
                uVar12 = 0;
                while( true ) {
                  sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,1)
                  ;
                  if (sVar11 <= uVar12) break;
                  args = 0;
                  while( true ) {
                    sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,
                                        2);
                    if (sVar11 <= args) break;
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
                    uVar2 = local_78._0_8_;
                    if (((int *)local_78._0_8_ == (int *)0x0) || (local_50 != 3)) {
                      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar5,"Assertion failed.")
                      ;
                      pcVar9 = std::runtime_error::~runtime_error;
                      puVar10 = &std::runtime_error::typeinfo;
                      goto LAB_001508a3;
                    }
                    sVar11 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,
                                        0);
                    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                            elementAccessHelper<unsigned_long>
                                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,3
                                       ,uVar12,args);
                    lVar8 = local_38[1] * args;
                    args = args + 1;
                    if (*(int *)(uVar2 + (sVar11 * uVar13 + sVar4) * 4) !=
                        local_80[(lVar8 + uVar12) * *local_38 + uVar13]) {
                      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar5,"test failed.");
                      pcVar9 = std::logic_error::~logic_error;
                      puVar10 = &std::logic_error::typeinfo;
LAB_001508a3:
                      __cxa_throw(plVar5,puVar10,pcVar9);
                    }
                  }
                  uVar12 = uVar12 + 1;
                }
                uVar13 = uVar13 + 1;
              } while( true );
            }
            plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar5,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
          }
          __cxa_throw(plVar5,puVar10,pcVar9);
        }
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        pcVar9 = std::logic_error::~logic_error;
        puVar10 = &std::logic_error::typeinfo;
      }
      __cxa_throw(plVar5,puVar10,pcVar9);
    }
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"test failed.");
    pcVar9 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar5,puVar10,pcVar9);
}

Assistant:

void ViewTest::shapeConstructorTest() {
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
    }
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6;
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                test(v(j, k) == data_[j+k*shape[0]]);
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 2;
        shape[1] = 4;
        shape[2] = 3;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                for(std::size_t p=0; p<v.shape(2); ++p) {
                    test(v(j, k, p) == data_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                }
            }
        }
    }
}